

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# getcolsb.c
# Opt level: O2

int fffr4s1(float *input,long ntodo,double scale,double zero,int nullcheck,char nullval,
           char *nullarray,int *anynull,char *output,int *status)

{
  float fVar1;
  ushort uVar2;
  long lVar3;
  char cVar4;
  long lVar5;
  double dVar6;
  
  if (nullcheck == 0) {
    lVar5 = 0;
    if (0 < ntodo) {
      lVar5 = ntodo;
    }
    if ((((scale != 1.0) || (NAN(scale))) || (zero != 0.0)) || (NAN(zero))) {
      for (lVar3 = 0; lVar5 != lVar3; lVar3 = lVar3 + 1) {
        dVar6 = (double)input[lVar3] * scale + zero;
        if (-128.49 <= dVar6) {
          if (dVar6 <= 127.49) {
            cVar4 = (char)(int)dVar6;
          }
          else {
            *status = -0xb;
            cVar4 = '\x7f';
          }
        }
        else {
          *status = -0xb;
          cVar4 = -0x80;
        }
        output[lVar3] = cVar4;
      }
    }
    else {
      for (lVar3 = 0; lVar5 != lVar3; lVar3 = lVar3 + 1) {
        fVar1 = input[lVar3];
        if (-128.49 <= fVar1) {
          if (fVar1 <= 127.49) {
            cVar4 = (char)(int)fVar1;
          }
          else {
            *status = -0xb;
            cVar4 = '\x7f';
          }
        }
        else {
          *status = -0xb;
          cVar4 = -0x80;
        }
        output[lVar3] = cVar4;
      }
    }
  }
  else if (((scale != 1.0) || (NAN(scale))) || ((zero != 0.0 || (NAN(zero))))) {
    lVar5 = 0;
    if (ntodo < 1) {
      ntodo = lVar5;
    }
    for (; ntodo != lVar5; lVar5 = lVar5 + 1) {
      uVar2 = *(ushort *)((long)input + lVar5 * 4 + 2);
      cVar4 = ((uVar2 & 0x7f80) == 0) * '\x02';
      if ((uVar2 & 0x7f80) == 0x7f80) {
        cVar4 = '\x01';
      }
      if (cVar4 == '\0') {
        dVar6 = (double)input[lVar5] * scale + zero;
        if (dVar6 < -128.49) {
LAB_0019afe2:
          *status = -0xb;
          output[lVar5] = -0x80;
        }
        else if (127.49 < dVar6) {
LAB_0019affc:
          *status = -0xb;
          output[lVar5] = '\x7f';
        }
        else {
          output[lVar5] = (char)(int)dVar6;
        }
      }
      else if (cVar4 == '\x01') {
        *anynull = 1;
        if (nullcheck == 1) {
          output[lVar5] = nullval;
        }
        else {
          nullarray[lVar5] = '\x01';
        }
      }
      else {
        if (zero < -128.49) goto LAB_0019afe2;
        if (127.49 < zero) goto LAB_0019affc;
        output[lVar5] = (char)(int)zero;
      }
    }
  }
  else {
    lVar5 = 0;
    if (ntodo < 1) {
      ntodo = lVar5;
    }
    for (; ntodo != lVar5; lVar5 = lVar5 + 1) {
      uVar2 = *(ushort *)((long)input + lVar5 * 4 + 2);
      cVar4 = ((uVar2 & 0x7f80) == 0) * '\x02';
      if ((uVar2 & 0x7f80) == 0x7f80) {
        cVar4 = '\x01';
      }
      if (cVar4 == '\0') {
        fVar1 = input[lVar5];
        if (-128.49 <= fVar1) {
          if (fVar1 <= 127.49) {
            output[lVar5] = (char)(int)fVar1;
          }
          else {
            *status = -0xb;
            output[lVar5] = '\x7f';
          }
        }
        else {
          *status = -0xb;
          output[lVar5] = -0x80;
        }
      }
      else if (cVar4 == '\x01') {
        *anynull = 1;
        if (nullcheck == 1) {
          output[lVar5] = nullval;
        }
        else {
          nullarray[lVar5] = '\x01';
        }
      }
      else {
        output[lVar5] = '\0';
      }
    }
  }
  return *status;
}

Assistant:

int fffr4s1(float *input,         /* I - array of values to be converted     */
            long ntodo,           /* I - number of elements in the array     */
            double scale,         /* I - FITS TSCALn or BSCALE value         */
            double zero,          /* I - FITS TZEROn or BZERO  value         */
            int nullcheck,        /* I - null checking code; 0 = don't check */
                                  /*     1:set null pixels = nullval         */
                                  /*     2: if null pixel, set nullarray = 1 */
            signed char nullval,  /* I - set null pixels, if nullcheck = 1   */
            char *nullarray,      /* I - bad pixel array, if nullcheck = 2   */
            int  *anynull,        /* O - set to 1 if any pixels are null     */
            signed char *output,  /* O - array of converted pixels           */
            int *status)          /* IO - error status                       */
/*
  Copy input to output following reading of the input from a FITS file.
  Check for null values and do datatype conversion and scaling if required.
  The nullcheck code value determines how any null values in the input array
  are treated.  A null value is an input pixel that is equal to NaN.  If 
  nullcheck = 0, then no checking for nulls is performed and any null values
  will be transformed just like any other pixel.  If nullcheck = 1, then the
  output pixel will be set = nullval if the corresponding input pixel is null.
  If nullcheck = 2, then if the pixel is null then the corresponding value of
  nullarray will be set to 1; the value of nullarray for non-null pixels 
  will = 0.  The anynull parameter will be set = 1 if any of the returned
  pixels are null, otherwise anynull will be returned with a value = 0;
*/
{
    long ii;
    double dvalue;
    short *sptr, iret;

    if (nullcheck == 0)     /* no null checking required */
    {
        if (scale == 1. && zero == 0.)      /* no scaling */
        {       
            for (ii = 0; ii < ntodo; ii++)
            {
                if (input[ii] < DSCHAR_MIN)
                {
                    *status = OVERFLOW_ERR;
                    output[ii] = -128;
                }
                else if (input[ii] > DSCHAR_MAX)
                {
                    *status = OVERFLOW_ERR;
                    output[ii] = 127;
                }
                else
                    output[ii] = (signed char) input[ii];
            }
        }
        else             /* must scale the data */
        {
            for (ii = 0; ii < ntodo; ii++)
            {
                dvalue = input[ii] * scale + zero;

                if (dvalue < DSCHAR_MIN)
                {
                    *status = OVERFLOW_ERR;
                    output[ii] = -128;
                }
                else if (dvalue > DSCHAR_MAX)
                {
                    *status = OVERFLOW_ERR;
                    output[ii] = 127;
                }
                else
                    output[ii] = (signed char) dvalue;
            }
        }
    }
    else        /* must check for null values */
    {
        sptr = (short *) input;

#if BYTESWAPPED && MACHINE != VAXVMS && MACHINE != ALPHAVMS
        sptr++;       /* point to MSBs */
#endif
        if (scale == 1. && zero == 0.)  /* no scaling */
        {       
            for (ii = 0; ii < ntodo; ii++, sptr += 2)
            {
              /* use redundant boolean logic in following statement */
              /* to suppress irritating Borland compiler warning message */
              if (0 != (iret = fnan(*sptr) ) )  /* test for NaN or underflow */
              {
                  if (iret == 1)  /* is it a NaN? */
                  {
                    *anynull = 1;
                    if (nullcheck == 1)
                        output[ii] = nullval;
                    else
                        nullarray[ii] = 1;
                  }
                  else            /* it's an underflow */
                     output[ii] = 0;
              }
              else
                {
                    if (input[ii] < DSCHAR_MIN)
                    {
                        *status = OVERFLOW_ERR;
                        output[ii] = -128;
                    }
                    else if (input[ii] > DSCHAR_MAX)
                    {
                        *status = OVERFLOW_ERR;
                        output[ii] = 127;
                    }
                    else
                        output[ii] = (signed char) input[ii];
                }
            }
        }
        else                  /* must scale the data */
        {
            for (ii = 0; ii < ntodo; ii++, sptr += 2)
            {
              if (0 != (iret = fnan(*sptr) ) )  /* test for NaN or underflow */
              {
                  if (iret == 1)  /* is it a NaN? */
                  {  
                    *anynull = 1;
                    if (nullcheck == 1)
                        output[ii] = nullval;
                    else
                        nullarray[ii] = 1;
                  }
                  else            /* it's an underflow */
                  {
                    if (zero < DSCHAR_MIN)
                    {
                        *status = OVERFLOW_ERR;
                        output[ii] = -128;
                    }
                    else if (zero > DSCHAR_MAX)
                    {
                        *status = OVERFLOW_ERR;
                        output[ii] = 127;
                    }
                    else
                        output[ii] = (signed char) zero;
                  }
              }
              else
                {
                    dvalue = input[ii] * scale + zero;

                    if (dvalue < DSCHAR_MIN)
                    {
                        *status = OVERFLOW_ERR;
                        output[ii] = -128;
                    }
                    else if (dvalue > DSCHAR_MAX)
                    {
                        *status = OVERFLOW_ERR;
                        output[ii] = 127;
                    }
                    else
                        output[ii] = (signed char) dvalue;
                }
            }
        }
    }
    return(*status);
}